

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O0

ssize_t jaegertracing::net::http::Request::read(int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_0000003c;
  istringstream local_1b8 [8];
  istringstream responseStream;
  string local_38 [8];
  string response;
  Socket *socket_local;
  
  response.field_2._8_8_ = __buf;
  SocketReader::read_abi_cxx11_((int)local_38,__buf,__nbytes);
  std::__cxx11::istringstream::istringstream(local_1b8,local_38,_S_in);
  parse((Request *)CONCAT44(in_register_0000003c,__fd),(istream *)local_1b8);
  std::__cxx11::istringstream::~istringstream(local_1b8);
  std::__cxx11::string::~string(local_38);
  return (ssize_t)(Request *)CONCAT44(in_register_0000003c,__fd);
}

Assistant:

Request Request::read(Socket & socket)
{
  std::string response = SocketReader::read(socket);
  std::istringstream responseStream(response);
  return Request::parse(responseStream);
}